

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genFetchCoordStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int fetchPosNdx)

{
  VkImageViewType viewType;
  ostream *poVar1;
  string *psVar2;
  IVec3 fetchPos;
  ostringstream s;
  undefined1 local_19c [124];
  ios_base local_120 [264];
  
  viewType = *(VkImageViewType *)((long)this + 0x8c);
  BindingModel::anon_unknown_1::ImageFetchInstanceImages::getFetchPos
            ((ImageFetchInstanceImages *)local_19c,viewType,*(deUint32 *)((long)this + 0x90),
             *(deUint32 *)((long)this + 0x94),fetchPosNdx);
  if ((viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY) || (viewType == VK_IMAGE_VIEW_TYPE_2D)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_19c + 0xc));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_19c + 0xc),"ivec2(",6);
    poVar1 = (ostream *)std::ostream::operator<<(local_19c + 0xc,local_19c._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_19c._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    std::__cxx11::stringbuf::str();
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_1D) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_19c + 0xc));
    std::ostream::operator<<((ostringstream *)(local_19c + 0xc),local_19c._0_4_);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_19c + 0xc));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_19c + 0xc),"ivec3(",6);
    poVar1 = (ostream *)std::ostream::operator<<(local_19c + 0xc,local_19c._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_19c._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_19c._8_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_19c + 0xc));
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

std::string ImageDescriptorCase::genFetchCoordStr (int fetchPosNdx) const
{
	DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE || m_descriptorType == vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE);
	const tcu::IVec3 fetchPos = ImageFetchInstanceImages::getFetchPos(m_viewType, m_baseMipLevel, m_baseArraySlice, fetchPosNdx);

	if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D)
	{
		return de::toString(fetchPos.x());
	}
	else if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D)
	{
		std::ostringstream buf;
		buf << "ivec2(" << fetchPos.x() << ", " << fetchPos.y() << ")";
		return buf.str();
	}
	else
	{
		std::ostringstream buf;
		buf << "ivec3(" << fetchPos.x() << ", " << fetchPos.y() << ", " << fetchPos.z() << ")";
		return buf.str();
	}
}